

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

ssh_key * rsa2_new_pub(ssh_keyalg *self,ptrlen data)

{
  _Bool _Var1;
  void *pvVar2;
  mp_int *pmVar3;
  ptrlen pl;
  RSAKey *rsa;
  BinarySource src [1];
  ssh_keyalg *self_local;
  ptrlen data_local;
  
  BinarySource_INIT__((BinarySource *)&rsa,data);
  pl = BinarySource_get_string((BinarySource *)src[0]._24_8_);
  _Var1 = ptrlen_eq_string(pl,"ssh-rsa");
  if (_Var1) {
    pvVar2 = safemalloc(1,0x48,0);
    *(ssh_keyalg **)((long)pvVar2 + 0x40) = self;
    pmVar3 = BinarySource_get_mp_ssh2((BinarySource *)src[0]._24_8_);
    *(mp_int **)((long)pvVar2 + 0x10) = pmVar3;
    pmVar3 = BinarySource_get_mp_ssh2((BinarySource *)src[0]._24_8_);
    *(mp_int **)((long)pvVar2 + 8) = pmVar3;
    *(undefined8 *)((long)pvVar2 + 0x18) = 0;
    *(undefined8 *)((long)pvVar2 + 0x30) = 0;
    *(undefined8 *)((long)pvVar2 + 0x28) = 0;
    *(undefined8 *)((long)pvVar2 + 0x20) = 0;
    *(undefined8 *)((long)pvVar2 + 0x38) = 0;
    if (*(int *)(src[0]._24_8_ + 0x18) == 0) {
      data_local.len = (long)pvVar2 + 0x40;
    }
    else {
      rsa2_freekey((ssh_key *)((long)pvVar2 + 0x40));
      data_local.len = 0;
    }
  }
  else {
    data_local.len = 0;
  }
  return (ssh_key *)data_local.len;
}

Assistant:

static ssh_key *rsa2_new_pub(const ssh_keyalg *self, ptrlen data)
{
    BinarySource src[1];
    RSAKey *rsa;

    BinarySource_BARE_INIT_PL(src, data);
    if (!ptrlen_eq_string(get_string(src), "ssh-rsa"))
        return NULL;

    rsa = snew(RSAKey);
    rsa->sshk.vt = self;
    rsa->exponent = get_mp_ssh2(src);
    rsa->modulus = get_mp_ssh2(src);
    rsa->private_exponent = NULL;
    rsa->p = rsa->q = rsa->iqmp = NULL;
    rsa->comment = NULL;

    if (get_err(src)) {
        rsa2_freekey(&rsa->sshk);
        return NULL;
    }

    return &rsa->sshk;
}